

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall CommandDrawInventoryBar::~CommandDrawInventoryBar(CommandDrawInventoryBar *this)

{
  ulong uVar1;
  
  (this->super_SBarInfoCommand)._vptr_SBarInfoCommand =
       (_func_int **)&PTR__CommandDrawInventoryBar_00863f70;
  if (this->counters != (CommandDrawNumber **)0x0) {
    if (this->size != 0) {
      uVar1 = 0;
      do {
        if (this->counters[uVar1] != (CommandDrawNumber *)0x0) {
          (*(this->counters[uVar1]->super_CommandDrawString).super_SBarInfoCommand.
            _vptr_SBarInfoCommand[1])();
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->size);
    }
    if (this->counters != (CommandDrawNumber **)0x0) {
      operator_delete__(this->counters);
      return;
    }
  }
  return;
}

Assistant:

~CommandDrawInventoryBar()
		{
			if(counters != NULL)
			{
				for(unsigned int i = 0;i < size;i++)
					delete counters[i];
				delete[] counters;
			}
		}